

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O1

hugeint_t duckdb::AddOperatorOverflowCheck::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t left,hugeint_t right)

{
  hugeint_t hVar1;
  bool bVar2;
  OutOfRangeException *this;
  PhysicalType type;
  hugeint_t rhs;
  hugeint_t value;
  hugeint_t value_00;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  uint64_t uVar3;
  
  rhs.upper = right.upper;
  rhs.lower = rhs.upper;
  uVar3 = rhs.upper;
  local_b0._M_dataplus._M_p = (pointer)left.lower;
  local_b0._M_string_length = left.upper;
  bVar2 = Hugeint::TryAddInPlace((Hugeint *)&local_b0,(hugeint_t *)right.lower,rhs);
  if (bVar2) {
    hVar1.upper = local_b0._M_string_length;
    hVar1.lower = (uint64_t)local_b0._M_dataplus._M_p;
    return hVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Overflow in addition of %s (%s + %s)!","");
  TypeIdToString_abi_cxx11_(&local_50,(duckdb *)0xcc,type);
  value.upper = uVar3;
  value.lower = left.upper;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_70,(NumericHelper *)left.lower,value);
  value_00.upper = uVar3;
  value_00.lower = rhs.upper;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_90,(NumericHelper *)right.lower,value_00);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_b0,&local_50,&local_70,&local_90);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}